

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double house(double *x,int N,double *v)

{
  double dVar1;
  double beta;
  double *v_local;
  int N_local;
  double *x_local;
  
  dVar1 = house_1(x,N,v);
  return dVar1;
}

Assistant:

double house(double*x,int N,double *v) {
	double beta;
	beta = house_1(x,N,v);
	return beta;
}